

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::fallback_format<long_double>(longdouble d,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  type tVar6;
  uint64_t n;
  char *pcVar7;
  int result;
  bool high;
  bool low;
  int digit;
  char *data;
  int num_digits;
  bool even;
  uint64_t significand;
  undefined1 auStack_310 [4];
  int shift;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  undefined1 local_188 [8];
  bigint denominator;
  bigint numerator;
  int *exp10_local;
  buffer<char> *buf_local;
  longdouble d_local;
  
  bigint::bigint((bigint *)&denominator.exp_);
  bigint::bigint((bigint *)local_188);
  bigint::bigint((bigint *)&upper_store.exp_);
  bigint::bigint((bigint *)&upper);
  value.e = 0;
  value._12_4_ = 0;
  fp::fp((fp *)auStack_310);
  bVar2 = fp::assign<long_double,_0>((fp *)auStack_310,d);
  iVar3 = 1;
  if (bVar2) {
    iVar3 = 2;
  }
  n = _auStack_310 << (sbyte)iVar3;
  if ((int)value.f < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10((bigint *)&denominator.exp_,-*exp10);
      bigint::assign((bigint *)&upper_store.exp_,(bigint *)&denominator.exp_);
      if (iVar3 != 1) {
        bigint::assign((bigint *)&upper,(bigint *)&denominator.exp_);
        bigint::operator<<=((bigint *)&upper,1);
        value._8_8_ = &upper;
      }
      bigint::operator*=((bigint *)&denominator.exp_,n);
      bigint::assign((bigint *)local_188,1);
      bigint::operator<<=((bigint *)local_188,iVar3 - (int)value.f);
    }
    else {
      bigint::assign((bigint *)&denominator.exp_,n);
      bigint::assign_pow10((bigint *)local_188,*exp10);
      bigint::operator<<=((bigint *)local_188,iVar3 - (int)value.f);
      bigint::assign((bigint *)&upper_store.exp_,1);
      if (iVar3 != 1) {
        bigint::assign((bigint *)&upper,2);
        value._8_8_ = &upper;
      }
    }
  }
  else {
    bigint::assign((bigint *)&denominator.exp_,n);
    bigint::operator<<=((bigint *)&denominator.exp_,(int)value.f);
    bigint::assign((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,(int)value.f);
    if (iVar3 != 1) {
      bigint::assign((bigint *)&upper,1);
      bigint::operator<<=((bigint *)&upper,(int)value.f + 1);
      value._8_8_ = &upper;
    }
    bigint::assign_pow10((bigint *)local_188,*exp10);
    bigint::operator<<=((bigint *)local_188,1);
  }
  if (value._8_8_ == 0) {
    value._8_8_ = &upper_store.exp_;
  }
  bVar2 = (_auStack_310 & 1) == 0;
  data._0_4_ = 0;
  pcVar7 = buffer<char>::data(buf);
  while( true ) {
    iVar3 = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_188);
    iVar4 = compare((bigint *)&denominator.exp_,(bigint *)&upper_store.exp_);
    iVar4 = iVar4 - (uint)bVar2;
    iVar5 = add_compare((bigint *)&denominator.exp_,(bigint *)value._8_8_,(bigint *)local_188);
    bVar1 = 0 < (int)(iVar5 + (uint)bVar2);
    iVar5 = (int)data + 1;
    pcVar7[(int)data] = (char)iVar3 + '0';
    if ((iVar4 < 0) || (bVar1)) break;
    bigint::operator*=((bigint *)&denominator.exp_,10);
    bigint::operator*=((bigint *)&upper_store.exp_,10);
    data._0_4_ = iVar5;
    if ((int *)value._8_8_ != &upper_store.exp_) {
      bigint::operator*=((bigint *)value._8_8_,10);
    }
  }
  if (iVar4 < 0) {
    if ((bVar1) &&
       ((iVar4 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                             (bigint *)local_188), 0 < iVar4 || ((iVar4 == 0 && (iVar3 % 2 != 0)))))
       ) {
      pcVar7[(int)data] = pcVar7[(int)data] + '\x01';
    }
  }
  else {
    pcVar7[(int)data] = pcVar7[(int)data] + '\x01';
  }
  tVar6 = to_unsigned<int>(iVar5);
  buffer<char>::try_resize(buf,(ulong)tVar6);
  *exp10 = *exp10 - (int)data;
  bigint::~bigint((bigint *)&upper);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)local_188);
  bigint::~bigint((bigint *)&denominator.exp_);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}